

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::need_picker(torrent *this)

{
  peer_connection *this_00;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  pointer this_01;
  type ctx;
  vector<peer_connection_*> *this_02;
  reference pppVar4;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *bits;
  peer_connection *p;
  iterator __end2;
  iterator __begin2;
  vector<peer_connection_*> *__range2;
  int64_t local_20;
  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
  local_18;
  __single_object pp;
  torrent *this_local;
  
  pp._M_t.
  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
       (__uniq_ptr_data<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>,_true,_true>
        )(__uniq_ptr_data<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>,_true,_true>
          )this;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->super_torrent_hot_members);
  if (!bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    local_20 = torrent_info::total_size(peVar3);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    torrent_info::piece_length(peVar3);
    ::std::make_unique<libtorrent::aux::piece_picker,long,int>((long *)&local_18,(int *)&local_20);
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1e & 1) != 0) {
      this_01 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::operator->(&local_18);
      piece_picker::we_have_all(this_01);
    }
    bVar1 = aux::file_progress::empty(&this->m_file_progress);
    if (bVar1) {
      ctx = ::std::
            unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ::operator*(&local_18);
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      torrent_info::files(peVar3);
      aux::file_progress::init(&this->m_file_progress,(EVP_PKEY_CTX *)ctx);
    }
    ::std::
    unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>::
    operator=(&(this->super_torrent_hot_members).m_picker,&local_18);
    update_gauge(this);
    this_02 = &(this->super_torrent_hot_members).m_connections;
    __end2 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin(&this_02->
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    );
    p = (peer_connection *)
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::end(&this_02->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                       *)&p), bVar1) {
      pppVar4 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&__end2);
      this_00 = *pppVar4;
      uVar2 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
      if ((uVar2 & 1) == 0) {
        bits = peer_connection::get_bitfield(this_00);
        peer_has(this,bits,this_00);
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end2);
    }
    ::std::
    unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>::
    ~unique_ptr(&local_18);
  }
  return;
}

Assistant:

void torrent::need_picker()
	{
		if (m_picker) return;

		TORRENT_ASSERT(valid_metadata());
		TORRENT_ASSERT(m_connections_initialized);

		INVARIANT_CHECK;

		// if we have all pieces we should not have a picker
		// unless we're in suggest mode
		TORRENT_ASSERT(!m_have_all
			|| settings().get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache);

		auto pp = std::make_unique<piece_picker>(m_torrent_file->total_size()
			, m_torrent_file->piece_length());

		if (m_have_all) pp->we_have_all();

		// initialize the file progress too
		if (m_file_progress.empty())
			m_file_progress.init(*pp, m_torrent_file->files());

		m_picker = std::move(pp);

		update_gauge();

		for (auto* const p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			if (p->is_disconnecting()) continue;
			peer_has(p->get_bitfield(), p);
		}
	}